

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_avsd_plus.c
# Opt level: O1

MPP_RET hal_avsd_plus_start(void *decoder,HalTaskInfo *task)

{
  MPP_RET MVar1;
  MPP_RET MVar2;
  char *fname;
  char *fmt;
  int level;
  ulong uVar3;
  MppDevRegWrCfg wr_cfg;
  MppDevRegRdCfg rd_cfg;
  undefined8 local_40;
  undefined8 local_38;
  undefined8 local_30;
  undefined8 local_28;
  
  if (((byte)avsd_hal_debug & 8) != 0) {
    _mpp_log_l(4,"hal_avsd_plus","In.","hal_avsd_plus_start");
  }
  if (decoder == (void *)0x0) {
    MVar1 = MPP_ERR_INIT;
    if (((byte)avsd_hal_debug & 4) == 0) goto LAB_001e6a6f;
    fmt = "input empty(%d).\n";
    level = 4;
    fname = (char *)0x0;
    uVar3 = 0x2aa;
  }
  else {
    if ((((ulong)(task->dec).flags & 0xc) != 0) &&
       (*(int *)(*(long *)((long)decoder + 0x88) + 0x30) == 0)) {
      MVar1 = MPP_ERR_UNKNOW;
      goto LAB_001e6a6f;
    }
    local_40 = *(undefined8 *)((long)decoder + 0x1a0);
    local_38 = 0xf0;
    if (((byte)avsd_hal_debug & 1) != 0) {
      if (hal_avsd_plus_start::fp == (FILE *)0x0) {
        hal_avsd_plus_start::fp = (FILE *)fopen("regs.txt","w+b");
      }
      if (hal_avsd_plus_start::fp != (FILE *)0x0) {
        fprintf((FILE *)hal_avsd_plus_start::fp,"frame %d\n",(ulong)hal_avsd_plus_start::frame_no);
        uVar3 = 0;
        do {
          fprintf((FILE *)hal_avsd_plus_start::fp,"reg[%03d]: %08x\n",uVar3 & 0xffffffff,
                  (ulong)*(uint *)(*(long *)((long)decoder + 0x1a0) + uVar3 * 4));
          uVar3 = uVar3 + 1;
        } while (uVar3 != 0x3c);
        hal_avsd_plus_start::frame_no = hal_avsd_plus_start::frame_no + 1;
        fflush((FILE *)hal_avsd_plus_start::fp);
      }
    }
    MVar1 = mpp_dev_ioctl(*(MppDev *)((long)decoder + 0x80),4,&local_40);
    if (MVar1 == MPP_OK) {
      local_30 = *(undefined8 *)((long)decoder + 0x1a0);
      local_28 = 0xf0;
      MVar1 = mpp_dev_ioctl(*(MppDev *)((long)decoder + 0x80),5,&local_30);
      if (MVar1 == MPP_OK) {
        MVar2 = mpp_dev_ioctl(*(MppDev *)((long)decoder + 0x80),0xf,(void *)0x0);
        MVar1 = MPP_OK;
        if (MVar2 != MPP_OK) {
          _mpp_log_l(2,"hal_avsd_plus","send cmd failed %d\n","hal_avsd_plus_start",
                     (ulong)(uint)MVar2);
          MVar1 = MVar2;
        }
        goto LAB_001e6a6f;
      }
      fmt = "set register read failed %d\n";
    }
    else {
      fmt = "set register write failed %d\n";
    }
    fname = "hal_avsd_plus_start";
    level = 2;
    uVar3 = (ulong)(uint)MVar1;
  }
  _mpp_log_l(level,"hal_avsd_plus",fmt,fname,uVar3);
LAB_001e6a6f:
  if (((byte)avsd_hal_debug & 8) != 0) {
    _mpp_log_l(4,"hal_avsd_plus","Out.","hal_avsd_plus_start");
  }
  return MVar1;
}

Assistant:

MPP_RET hal_avsd_plus_start(void *decoder, HalTaskInfo *task)
{
    MPP_RET ret = MPP_ERR_UNKNOW;
    AvsdHalCtx_t *p_hal = (AvsdHalCtx_t *)decoder;

    AVSD_HAL_TRACE("In.");
    INP_CHECK(ret, NULL == decoder);

    if ((task->dec.flags.parse_err || task->dec.flags.ref_err) &&
        !p_hal->dec_cfg->base.disable_error) {
        goto __RETURN;
    }

    do {
        MppDevRegWrCfg wr_cfg;
        MppDevRegRdCfg rd_cfg;

        wr_cfg.reg = p_hal->p_regs;
        wr_cfg.size = AVSD_REGISTERS * sizeof(RK_U32);
        wr_cfg.offset = 0;

        if (avsd_hal_debug & AVSD_HAL_DBG_ERROR) {
            static RK_U32 frame_no = 0;
            static FILE *fp = NULL;
            RK_U32 i;

            if (!fp)
                fp = fopen("regs.txt", "w+b");

            if (fp) {
                fprintf(fp, "frame %d\n", frame_no);

                for (i = 0; i < AVSD_REGISTERS; i++)
                    fprintf(fp, "reg[%03d]: %08x\n", i, p_hal->p_regs[i]);

                frame_no++;

                fflush(fp);
            }
        }

        ret = mpp_dev_ioctl(p_hal->dev, MPP_DEV_REG_WR, &wr_cfg);
        if (ret) {
            mpp_err_f("set register write failed %d\n", ret);
            break;
        }

        rd_cfg.reg = p_hal->p_regs;
        rd_cfg.size = AVSD_REGISTERS * sizeof(RK_U32);
        rd_cfg.offset = 0;

        ret = mpp_dev_ioctl(p_hal->dev, MPP_DEV_REG_RD, &rd_cfg);
        if (ret) {
            mpp_err_f("set register read failed %d\n", ret);
            break;
        }

        ret = mpp_dev_ioctl(p_hal->dev, MPP_DEV_CMD_SEND, NULL);
        if (ret) {
            mpp_err_f("send cmd failed %d\n", ret);
            break;
        }
    } while (0);

__RETURN:
    AVSD_HAL_TRACE("Out.");

    return ret;
}